

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O3

void GetChunk(ListChunkTraverseInfo *info,Col_Word **chunkPtr,int reverse)

{
  byte bVar1;
  anon_struct_24_3_2a41905f *paVar2;
  code *pcVar3;
  uint uVar4;
  ulong uVar5;
  Col_Word CVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  ulong *puVar10;
  Col_Word *pCVar11;
  size_t first;
  size_t last;
  long local_30;
  long local_28;
  
  puVar10 = (ulong *)info->list;
  while( true ) {
    if (puVar10 == (ulong *)0x0) {
      return;
    }
    if (((ulong)puVar10 & 0xf) == 0) break;
    uVar4 = immediateWordTypes[(uint)puVar10 & 0x1f];
LAB_0010fe5a:
    if ((int)uVar4 < 0x1e) {
      if (-2 < (int)uVar4) {
        if (uVar4 != 0xffffffff) {
          if ((uVar4 != 0x16) && (uVar4 != 0x1a)) {
            return;
          }
          if (reverse == 0) {
            lVar8 = 0;
          }
          else {
            lVar8 = 1 - info->max;
          }
          puVar10 = puVar10 + info->start + lVar8 + 2;
          goto LAB_00110016;
        }
        goto LAB_0010ffbf;
      }
      if (uVar4 != 0xfffffffa) {
        if (uVar4 != 0xfffffff9) {
          return;
        }
        *chunkPtr = (Col_Word *)0xffffffffffffffff;
        return;
      }
      puVar10 = (ulong *)((ulong)puVar10 & 0xfffffffffffffff7);
    }
    else if (uVar4 == 0x1e) {
      info->start = info->start + puVar10[2];
      puVar10 = (ulong *)puVar10[1];
    }
    else {
      if ((uVar4 != 0x22) && (uVar4 != 0x26)) {
        return;
      }
      uVar5 = (ulong)*(ushort *)((long)puVar10 + 2);
      if (uVar5 == 0) {
        uVar5 = Col_ListLength(puVar10[2]);
      }
      uVar9 = info->start;
      if (reverse == 0) {
        sVar7 = info->max;
        if ((uVar9 + sVar7) - 1 < uVar5) goto LAB_0010fed7;
        lVar8 = 0;
      }
      else {
        if (uVar9 < uVar5) {
LAB_0010fed7:
          puVar10 = *(ulong **)(info->list + 0x10);
          goto LAB_0010ff7f;
        }
        sVar7 = info->max;
        lVar8 = sVar7 - 1;
      }
      if (uVar9 - lVar8 < uVar5) {
        paVar2 = info->backtracks;
        CVar6 = info->list;
        bVar1 = *(byte *)(CVar6 + 1);
        lVar8 = (ulong)bVar1 - 1;
        pCVar11 = &paVar2[lVar8].list;
        paVar2[lVar8].prevDepth = info->prevDepth;
        info->prevDepth = (uint)bVar1;
        if (reverse == 0) {
          *pCVar11 = *(Col_Word *)(CVar6 + 0x18);
          paVar2[lVar8].max = (uVar9 - uVar5) + sVar7;
          sVar7 = uVar5 - uVar9;
          lVar8 = 0x10;
        }
        else {
          *pCVar11 = *(Col_Word *)(CVar6 + 0x10);
          paVar2[lVar8].max = sVar7 + uVar5 + ~uVar9;
          info->start = uVar9 - uVar5;
          sVar7 = (uVar9 - uVar5) + 1;
          lVar8 = 0x18;
        }
        info->max = sVar7;
        puVar10 = *(ulong **)(CVar6 + lVar8);
      }
      else {
        info->start = uVar9 - uVar5;
        puVar10 = *(ulong **)(info->list + 0x18);
      }
    }
LAB_0010ff7f:
    info->list = (Col_Word)puVar10;
  }
  if (((byte)*puVar10 & 2) != 0) {
    uVar4 = (byte)*puVar10 & 0xfffffffe;
    goto LAB_0010fe5a;
  }
LAB_0010ffbf:
  uVar5 = *puVar10;
  pcVar3 = *(code **)((uVar5 & 0xfffffffffffffffe) + 0x38);
  if (pcVar3 == (code *)0x0) {
    info->max = 1;
    CVar6 = (**(code **)((uVar5 & 0xfffffffffffffffe) + 0x30))(puVar10,info->start);
    info->e = CVar6;
    *chunkPtr = &info->e;
    return;
  }
  (*pcVar3)(puVar10,info->start,chunkPtr,&local_30,&local_28);
  uVar5 = info->max;
  if (reverse == 0) {
    uVar9 = (local_28 - info->start) + 1;
    if (uVar9 < uVar5) {
      info->max = uVar9;
    }
    *chunkPtr = *chunkPtr + (info->start - local_30);
    return;
  }
  local_30 = info->start - local_30;
  uVar9 = local_30 + 1;
  if (uVar9 < uVar5) {
    info->max = uVar9;
    return;
  }
  puVar10 = *chunkPtr + (local_30 - uVar5) + 1;
LAB_00110016:
  *chunkPtr = puVar10;
  return;
}

Assistant:

static void
GetChunk(
    RopeChunkTraverseInfo *info,    /*!< Traversal info. */
    Col_RopeChunk *chunkPtr,        /*!< Chunk info for leaf. */
    int reverse)                    /*!< Whether to traverse in reverse order.*/
{
    int type;

    for (;;) {
        /*
         * Descend into structure until we find a suitable leaf.
         */

        type = WORD_TYPE(info->rope);
        switch (type) {
        case WORD_TYPE_SUBROPE:
            /*
             * Subrope: recurse on source rope.
             */

            info->start += WORD_SUBROPE_FIRST(info->rope);
            info->rope = WORD_SUBROPE_SOURCE(info->rope);
            continue;

        case WORD_TYPE_CONCATROPE: {
            /*
             * Concat: descend into covered arms.
             */

            int depth;
            size_t leftLength = WORD_CONCATROPE_LEFT_LENGTH(info->rope);
            if (leftLength == 0) {
                leftLength = Col_RopeLength(WORD_CONCATROPE_LEFT(info->rope));
            }
            if (info->start + (reverse ? 0 : info->max-1) < leftLength) {
                /*
                 * Recurse on left arm only.
                 */

                info->rope = WORD_CONCATROPE_LEFT(info->rope);
                continue;
            }
            if (info->start - (reverse ? info->max-1 : 0) >= leftLength) {
                /*
                 * Recurse on right arm only.
                 */

                info->start -= leftLength;
                info->rope = WORD_CONCATROPE_RIGHT(info->rope);
                continue;
            }

            /*
             * Push right (resp. left for reverse) onto stack and recurse on
             * left (resp. right).
             */

            ASSERT(info->backtracks);
            depth = WORD_CONCATROPE_DEPTH(info->rope);
            ASSERT(depth <= info->maxDepth);
            info->backtracks[depth-1].prevDepth = info->prevDepth;
            info->prevDepth = depth;
            if (reverse) {
                ASSERT(info->start >= leftLength);
                info->backtracks[depth-1].rope
                        = WORD_CONCATROPE_LEFT(info->rope);
                info->backtracks[depth-1].max = info->max
                        - (info->start-leftLength+1);
                info->start -= leftLength;
                info->max = info->start+1;
                info->rope = WORD_CONCATROPE_RIGHT(info->rope);
            } else {
                ASSERT(info->start < leftLength);
                info->backtracks[depth-1].rope
                        = WORD_CONCATROPE_RIGHT(info->rope);
                info->backtracks[depth-1].max = info->max
                        - (leftLength-info->start);
                info->max = leftLength-info->start;
                info->rope = WORD_CONCATROPE_LEFT(info->rope);
            }
            continue;
            }

            /* WORD_TYPE_UNKNOWN */
        }

        break;
    }

    /*
     * Get leaf data.
     */

    ASSERT(info->start + (reverse ? info->max-1 : 0) >= 0);
    ASSERT(info->start + (reverse ? 0 : info->max-1) < Col_RopeLength(info->rope));
    switch (type) {
    case WORD_TYPE_CHARBOOL:
        ASSERT(WORD_CHAR_WIDTH(info->rope));
        ASSERT(info->start == 0);
        ASSERT(info->max == 1);
        chunkPtr->format = (Col_StringFormat) WORD_CHAR_WIDTH(info->rope);
        info->c = WORD_CHAR_CP(info->rope);
        chunkPtr->data = &info->c;
        break;

    case WORD_TYPE_SMALLSTR:
        chunkPtr->format = COL_UCS1;
        chunkPtr->data = WORD_SMALLSTR_DATA(info->rope) + info->start
                - (reverse ? info->max-1 : 0);
        break;

    case WORD_TYPE_UCSSTR: {
        /*
         * Fixed-width flat strings: traverse range of chars.
         */

        chunkPtr->format = (Col_StringFormat) WORD_UCSSTR_FORMAT(info->rope);
        chunkPtr->data = WORD_UCSSTR_DATA(info->rope)
                + (info->start - (reverse ? info->max-1 : 0))
                * CHAR_WIDTH(chunkPtr->format);
        break;
        }

    case WORD_TYPE_UTFSTR:
        /*
         * Variable-width flat string.
         */

        chunkPtr->format = (Col_StringFormat) WORD_UTFSTR_FORMAT(info->rope);
        switch (chunkPtr->format) {
        case COL_UTF8:
            chunkPtr->data = Col_Utf8Addr(
                    (const Col_Char1 *) WORD_UTFSTR_DATA(info->rope),
                    info->start - (reverse ? info->max-1 : 0),
                    WORD_UTFSTR_LENGTH(info->rope),
                    WORD_UTFSTR_BYTELENGTH(info->rope));
            break;

        case COL_UTF16:
            chunkPtr->data = Col_Utf16Addr(
                    (const Col_Char2 *) WORD_UTFSTR_DATA(info->rope),
                    info->start - (reverse ? info->max-1 : 0),
                    WORD_UTFSTR_LENGTH(info->rope),
                    WORD_UTFSTR_BYTELENGTH(info->rope));
            break;
        }
        break;

    case WORD_TYPE_CUSTOM: {
        Col_CustomRopeType *typeInfo
                = (Col_CustomRopeType *) WORD_TYPEINFO(info->rope);
        ASSERT(typeInfo->type.type == COL_ROPE);
        if (typeInfo->chunkAtProc) {
            /*
             * Get chunk at start index.
             */

            size_t first, last;
            typeInfo->chunkAtProc(info->rope, info->start, chunkPtr, &first,
                    &last);

            /*
             * Restrict to traversed range.
             */

            if (reverse) {
                if (info->max > info->start-first+1) {
                    info->max = info->start-first+1;
                } else {
                    switch (chunkPtr->format) {
                    case COL_UCS1:
                    case COL_UCS2:
                    case COL_UCS4:
                        chunkPtr->data = (const char *) chunkPtr->data
                                + ((info->start-first)-(info->max-1))
                                * CHAR_WIDTH(chunkPtr->format);
                        break;

                    case COL_UTF8:
                        chunkPtr->data = Col_Utf8Addr(
                                (const Col_Char1 *) chunkPtr->data,
                                ((info->start-first)-(info->max-1)),
                                last-first+1, chunkPtr->byteLength);
                        break;

                    case COL_UTF16:
                        chunkPtr->data = Col_Utf16Addr(
                                (const Col_Char2 *) chunkPtr->data,
                                ((info->start-first)-(info->max-1)),
                                last-first+1, chunkPtr->byteLength);
                        break;
                    }
                }
            } else {
                if (info->max > last-info->start+1) {
                    info->max = last-info->start+1;
                }
                switch (chunkPtr->format) {
                case COL_UCS1:
                case COL_UCS2:
                case COL_UCS4:
                    chunkPtr->data = (const char *) chunkPtr->data
                            + (info->start-first)
                            * CHAR_WIDTH(chunkPtr->format);
                    break;

                case COL_UTF8:
                    chunkPtr->data = Col_Utf8Addr(
                            (const Col_Char1 *) chunkPtr->data,
                            (info->start-first), last-first+1,
                            chunkPtr->byteLength);
                    break;

                case COL_UTF16:
                    chunkPtr->data = Col_Utf16Addr(
                            (const Col_Char2 *) chunkPtr->data,
                            (info->start-first), last-first+1,
                            chunkPtr->byteLength);
                    break;
                }
            }
        } else {
            /*
             * Traverse chars individually.
             */

            info->max = 1;
            chunkPtr->format = COL_UCS4;
            info->c = typeInfo->charAtProc(info->rope, info->start);
            chunkPtr->data = &info->c;
        }
        break;
        }

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
    }
}